

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableStringFieldGenerator::GenerateBuildingCode
          (RepeatedImmutableStringFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "if ($get_mutable_bit_builder$) {\n  $name$_ = $name$_.getUnmodifiableView();\n  $clear_mutable_bit_builder$;\n}\nresult.$name$_ = $name$_;\n"
                    );
  return;
}

Assistant:

void RepeatedImmutableStringFieldGenerator::GenerateBuildingCode(
    io::Printer* printer) const {
  // The code below ensures that the result has an immutable list. If our
  // list is immutable, we can just reuse it. If not, we make it immutable.

  printer->Print(variables_,
                 "if ($get_mutable_bit_builder$) {\n"
                 "  $name$_ = $name$_.getUnmodifiableView();\n"
                 "  $clear_mutable_bit_builder$;\n"
                 "}\n"
                 "result.$name$_ = $name$_;\n");
}